

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FigureTests-v5.cpp
# Opt level: O2

void __thiscall
v5::FigureTests_v5_cloned_square_via_base_pointer_should_return_same_area_Test::
~FigureTests_v5_cloned_square_via_base_pointer_should_return_same_area_Test
          (FigureTests_v5_cloned_square_via_base_pointer_should_return_same_area_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(FigureTests_v5, cloned_square_via_base_pointer_should_return_same_area)
{
    auto a = 4.;
    auto square = Square{a};
    auto square_figure = static_cast<Figure*>(&square);
    auto figure = object::clone(square_figure);

    ASSERT_THAT( square.area(), Eq(a*a));
    ASSERT_THAT(figure->area(), Eq(square.area()));
}